

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O2

void __thiscall helics::MultiBroker::generateLocalAddressString_abi_cxx11_(MultiBroker *this)

{
  long in_RSI;
  
  generateLocalAddressString_abi_cxx11_((string *)this,(MultiBroker *)(in_RSI + -8));
  return;
}

Assistant:

std::string MultiBroker::generateLocalAddressString() const
{
    switch (type) {
        case CoreType::INPROC:
        case CoreType::IPC:
        case CoreType::INTERPROCESS:
        case CoreType::TEST:
            return getIdentifier();
        default:
            break;
    }
    auto* netcomm = dynamic_cast<NetworkCommsInterface*>(masterComm.get());
    if (netcomm != nullptr) {
        return netcomm->getAddress();
    }
    return getIdentifier();
}